

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QPersistentModelIndex,QHashDummyValue>::emplace_helper<QHashDummyValue_const&>
          (QHash<QPersistentModelIndex,QHashDummyValue> *this,QPersistentModelIndex *key,
          QHashDummyValue *args)

{
  byte bVar1;
  Entry *pEVar2;
  QPersistentModelIndexData *pQVar3;
  piter pVar4;
  long in_FS_OFFSET;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
  findOrInsert<QPersistentModelIndex>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> **)this,key);
  if (local_38[0x10] == false) {
    pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
    bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f];
    pQVar3 = key->d;
    key->d = (QPersistentModelIndexData *)0x0;
    *(QPersistentModelIndexData **)pEVar2[bVar1].storage.data = pQVar3;
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }